

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  int iVar1;
  BPMNode *leaves;
  ulong uVar2;
  BPMNode *pBVar3;
  BPMNode **ppBVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  size_t __nmemb;
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  BPMLists lists;
  BPMLists local_70;
  BPMNode **local_38;
  
  if ((ulong)(uint)(1 << ((byte)maxbitlen & 0x1f)) <= numcodes - 1) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  uVar2 = 0;
  __nmemb = 0;
  do {
    if (frequencies[uVar2] != 0) {
      leaves[__nmemb].weight = frequencies[uVar2];
      leaves[__nmemb].index = (uint)uVar2;
      __nmemb = __nmemb + 1;
    }
    uVar2 = uVar2 + 1;
  } while ((uVar2 & 0xffffffff) != numcodes);
  uVar2 = 0;
  do {
    lengths[uVar2] = 0;
    uVar2 = uVar2 + 1;
  } while ((uVar2 & 0xffffffff) != numcodes);
  if (__nmemb == 1) {
    uVar7 = leaves->index;
    lengths[uVar7] = 1;
    lengths[(ulong)uVar7 == 0] = 1;
  }
  else {
    if (__nmemb != 0) {
      qsort(leaves,__nmemb,0x18,bpmnode_compare);
      local_70.memsize = (maxbitlen + 1) * maxbitlen * 2;
      uVar2 = (ulong)local_70.memsize;
      local_70.nextfree = 0;
      local_70.numfree = local_70.memsize;
      local_70.listsize = maxbitlen;
      pBVar3 = (BPMNode *)malloc(uVar2 * 0x18);
      local_70.memory = pBVar3;
      local_70.freelist = (BPMNode **)malloc(uVar2 * 8);
      local_38 = local_70.freelist;
      ppBVar4 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      local_70.chains0 = ppBVar4;
      local_70.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      iVar12 = (int)((ulong)pBVar3 >> 0x20);
      auVar11._0_4_ = -(uint)(iVar12 == 0 && (int)pBVar3 == 0);
      auVar11._4_4_ = -(uint)((int)local_38 == 0 && (int)((ulong)local_38 >> 0x20) == 0);
      auVar11._8_4_ = -(uint)((int)((ulong)ppBVar4 >> 0x20) == 0 && (int)ppBVar4 == 0);
      auVar11._12_4_ =
           -(uint)((int)local_70.chains1 == 0 && (int)((ulong)local_70.chains1 >> 0x20) == 0);
      iVar1 = movmskps((int)local_70.chains1,auVar11);
      uVar7 = 0x53;
      if (iVar1 == 0) {
        if (uVar2 != 0) {
          uVar9 = 0;
          uVar10 = 1;
          uVar5 = 0;
          auVar8._8_4_ = (int)pBVar3;
          auVar8._0_8_ = pBVar3;
          auVar8._12_4_ = iVar12;
          do {
            local_38[uVar5] =
                 (BPMNode *)
                 ((long)&pBVar3[uVar9 & 0xffffffff].weight + ((uVar9 >> 0x20) * 0x18 << 0x20));
            (local_38 + uVar5)[1] =
                 (BPMNode *)
                 (((uVar10 >> 0x20) * 0x18 << 0x20) + (uVar10 & 0xffffffff) * 0x18 + auVar8._8_8_);
            uVar5 = uVar5 + 2;
            uVar9 = uVar9 + 2;
            uVar10 = uVar10 + 2;
          } while (uVar2 != uVar5);
        }
        bpmnode_create(&local_70,leaves->weight,1,(BPMNode *)0x0);
        bpmnode_create(&local_70,leaves[1].weight,2,(BPMNode *)0x0);
        if ((ulong)local_70.listsize != 0) {
          uVar2 = 0;
          do {
            local_70.chains0[uVar2] = local_70.memory;
            local_70.chains1[uVar2] = local_70.memory + 1;
            uVar2 = uVar2 + 1;
          } while (local_70.listsize != uVar2);
        }
        uVar2 = __nmemb * 2 - 2;
        if (uVar2 != 2) {
          uVar5 = 2;
          do {
            boundaryPM(&local_70,leaves,__nmemb,maxbitlen - 1,(int)uVar5);
            uVar5 = (ulong)((int)uVar5 + 1);
          } while (uVar2 != uVar5);
        }
        uVar7 = 0;
        for (pBVar3 = local_70.chains1[maxbitlen - 1]; pBVar3 != (BPMNode *)0x0;
            pBVar3 = pBVar3->tail) {
          if (pBVar3->index != 0) {
            uVar2 = 0;
            do {
              lengths[leaves[uVar2].index] = lengths[leaves[uVar2].index] + 1;
              uVar6 = (int)uVar2 + 1;
              uVar2 = (ulong)uVar6;
            } while (uVar6 != pBVar3->index);
          }
        }
      }
      ppBVar4 = local_70.chains1;
      free(local_70.memory);
      free(local_70.freelist);
      free(local_70.chains0);
      free(ppBVar4);
      goto LAB_001a2fe6;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar7 = 0;
LAB_001a2fe6:
  free(leaves);
  return uVar7;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen)
{
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i)
  {
    if(frequencies[i] > 0)
    {
      leaves[numpresent].weight = frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  for(i = 0; i != numcodes; ++i) lengths[i] = 0;

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0)
  {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  }
  else if(numpresent == 1)
  {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  }
  else
  {
    BPMLists lists;
    BPMNode* node;

    qsort(leaves, numpresent, sizeof(BPMNode), bpmnode_compare);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error)
    {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i)
      {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, maxbitlen - 1, i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail)
      {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}